

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDocSetRootElement(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlNodePtr val_00;
  int local_34;
  xmlNodePtr pxStack_30;
  int n_root;
  xmlNodePtr root;
  int n_doc;
  xmlDocPtr doc;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (root._4_4_ = 0; (int)root._4_4_ < 4; root._4_4_ = root._4_4_ + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlDocPtr(root._4_4_,0);
      pxStack_30 = gen_xmlNodePtr_in(local_34,1);
      val_00 = (xmlNodePtr)xmlDocSetRootElement(val,pxStack_30);
      if (val == (xmlDocPtr)0x0) {
        xmlFreeNode(pxStack_30);
        pxStack_30 = (xmlNodePtr)0x0;
      }
      desret_xmlNodePtr(val_00);
      call_tests = call_tests + 1;
      des_xmlDocPtr(root._4_4_,val,0);
      des_xmlNodePtr_in(local_34,pxStack_30,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)root._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlDocSetRootElement(void) {
    int test_ret = 0;

    int mem_base;
    xmlNodePtr ret_val;
    xmlDocPtr doc; /* the document */
    int n_doc;
    xmlNodePtr root; /* the new document root element, if root is NULL no action is taken, to remove a node from a document use xmlUnlinkNode(root) instead. */
    int n_root;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_root = 0;n_root < gen_nb_xmlNodePtr_in;n_root++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        root = gen_xmlNodePtr_in(n_root, 1);

        ret_val = xmlDocSetRootElement(doc, root);
        if (doc == NULL) { xmlFreeNode(root) ; root = NULL ; }
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlNodePtr_in(n_root, root, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDocSetRootElement",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_root);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}